

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<const_BayesianGameWithClusterInfo>
boost::
dynamic_pointer_cast<BayesianGameWithClusterInfo_const,BayesianGameIdenticalPayoffInterface_const>
          (shared_ptr<const_BayesianGameIdenticalPayoffInterface> *r)

{
  shared_ptr<const_BayesianGameWithClusterInfo> *this;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> *r_00;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar1;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> *in_RSI;
  element_type *in_RDI;
  shared_ptr<const_BayesianGameWithClusterInfo> sVar2;
  E *p;
  
  this = (shared_ptr<const_BayesianGameWithClusterInfo> *)
         shared_ptr<const_BayesianGameIdenticalPayoffInterface>::get(in_RSI);
  if (this == (shared_ptr<const_BayesianGameWithClusterInfo> *)0x0) {
    r_00 = (shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x0;
  }
  else {
    r_00 = (shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)
           __dynamic_cast(this,&BayesianGameIdenticalPayoffInterface::typeinfo,
                          &BayesianGameWithClusterInfo::typeinfo,0x20);
  }
  if (r_00 == (shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x0) {
    shared_ptr<const_BayesianGameWithClusterInfo>::shared_ptr
              ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8cab32);
    sVar1.pi_ = extraout_RDX_00;
  }
  else {
    shared_ptr<BayesianGameWithClusterInfo_const>::
    shared_ptr<BayesianGameIdenticalPayoffInterface_const>(this,r_00,(element_type *)0x8cab26);
    sVar1.pi_ = extraout_RDX;
  }
  sVar2.pn.pi_ = sVar1.pi_;
  sVar2.px = in_RDI;
  return sVar2;
}

Assistant:

shared_ptr<T> dynamic_pointer_cast( shared_ptr<U> const & r ) BOOST_NOEXCEPT
{
    (void) dynamic_cast< T* >( static_cast< U* >( 0 ) );

    typedef typename shared_ptr<T>::element_type E;

    E * p = dynamic_cast< E* >( r.get() );
    return p? shared_ptr<T>( r, p ): shared_ptr<T>();
}